

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall Rml::Context::SetDensityIndependentPixelRatio(Context *this,float dp_ratio)

{
  int iVar1;
  int iVar2;
  Element *this_00;
  ElementDocument *this_01;
  
  if ((this->density_independent_pixel_ratio != dp_ratio) ||
     (NAN(this->density_independent_pixel_ratio) || NAN(dp_ratio))) {
    this->density_independent_pixel_ratio = dp_ratio;
    iVar1 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,true);
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        this_00 = Element::GetChild((this->root)._M_t.
                                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                    .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,iVar1
                                   );
        this_01 = Element::GetOwnerDocument(this_00);
        if (this_01 != (ElementDocument *)0x0) {
          ElementDocument::DirtyMediaQueries(this_01);
          Element::OnDpRatioChangeRecursive(&this_01->super_Element);
        }
        iVar1 = iVar1 + 1;
        iVar2 = Element::GetNumChildren
                          ((this->root)._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,true);
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

void Context::SetDensityIndependentPixelRatio(float dp_ratio)
{
	if (density_independent_pixel_ratio != dp_ratio)
	{
		density_independent_pixel_ratio = dp_ratio;

		for (int i = 0; i < root->GetNumChildren(true); ++i)
		{
			ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
			if (document)
			{
				document->DirtyMediaQueries();
				document->OnDpRatioChangeRecursive();
			}
		}
	}
}